

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

WeierstrassPoint * ecdsa_decode(ptrlen encoded,ec_curve *curve)

{
  byte bVar1;
  uint uVar2;
  WeierstrassPoint *P;
  mp_int *pmVar3;
  mp_int *y;
  ulong wanted;
  ptrlen pVar4;
  BinarySource src [1];
  BinarySource local_48;
  
  local_48.len = encoded.len;
  local_48.data = encoded.ptr;
  local_48.binarysource_ = &local_48;
  if (curve->type != EC_WEIERSTRASS) {
    __assert_fail("curve->type == EC_WEIERSTRASS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                  ,0x1a2,"WeierstrassPoint *ecdsa_decode(ptrlen, const struct ec_curve *)");
  }
  local_48.pos = 0;
  local_48.err = BSE_NO_ERROR;
  bVar1 = BinarySource_get_byte(&local_48);
  wanted = (local_48.binarysource_)->len - (local_48.binarysource_)->pos;
  if (bVar1 - 2 < 2) {
    pVar4 = BinarySource_get_data(local_48.binarysource_,wanted);
    pmVar3 = mp_from_bytes_be(pVar4);
    P = ecc_weierstrass_point_new_from_x((curve->field_6).w.wc,pmVar3,(uint)(bVar1 & 1));
    mp_free(pmVar3);
    if (P == (WeierstrassPoint *)0x0) {
      return (WeierstrassPoint *)0x0;
    }
  }
  else if (bVar1 == 4) {
    if ((wanted & 1) != 0) {
      return (WeierstrassPoint *)0x0;
    }
    pVar4 = BinarySource_get_data(local_48.binarysource_,wanted >> 1);
    pmVar3 = mp_from_bytes_be(pVar4);
    pVar4 = BinarySource_get_data(local_48.binarysource_,wanted >> 1);
    y = mp_from_bytes_be(pVar4);
    P = ecc_weierstrass_point_new((curve->field_6).w.wc,pmVar3,y);
    mp_free(pmVar3);
    mp_free(y);
  }
  else {
    if (bVar1 != 0) {
      return (WeierstrassPoint *)0x0;
    }
    P = ecc_weierstrass_point_new_identity((curve->field_6).w.wc);
  }
  uVar2 = ecc_weierstrass_point_valid(P);
  if (uVar2 == 0) {
    ecc_weierstrass_point_free(P);
    return (WeierstrassPoint *)0x0;
  }
  return P;
}

Assistant:

static WeierstrassPoint *ecdsa_decode(
    ptrlen encoded, const struct ec_curve *curve)
{
    assert(curve->type == EC_WEIERSTRASS);
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, encoded);
    unsigned char format_type = get_byte(src);

    WeierstrassPoint *P;

    size_t len = get_avail(src);
    mp_int *x;
    mp_int *y;

    switch (format_type) {
      case 0:
        /* The identity. */
        P = ecc_weierstrass_point_new_identity(curve->w.wc);
        break;
      case 2:
      case 3:
        /* A compressed point, in which the x-coordinate is stored in
         * full, and y is deduced from that and a single bit
         * indicating its parity (stored in the format type byte). */
        x = mp_from_bytes_be(get_data(src, len));
        P = ecc_weierstrass_point_new_from_x(curve->w.wc, x, format_type & 1);
        mp_free(x);
        if (!P)            /* this can fail if the input is invalid */
            return NULL;
        break;
      case 4:
        /* An uncompressed point: the x,y coordinates are stored in
         * full. We expect the rest of the string to have even length,
         * and be divided half and half between the two values. */
        if (len % 2 != 0)
            return NULL;
        len /= 2;
        x = mp_from_bytes_be(get_data(src, len));
        y = mp_from_bytes_be(get_data(src, len));
        P = ecc_weierstrass_point_new(curve->w.wc, x, y);
        mp_free(x);
        mp_free(y);
        break;
      default:
        /* An unrecognised type byte. */
        return NULL;
    }

    /* Verify the point is on the curve */
    if (!ecc_weierstrass_point_valid(P)) {
        ecc_weierstrass_point_free(P);
        return NULL;
    }

    return P;
}